

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

APInt __thiscall llvm::APInt::sdiv_ov(APInt *this,APInt *RHS,bool *Overflow)

{
  bool bVar1;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  APInt AVar2;
  undefined1 local_29;
  bool *Overflow_local;
  APInt *RHS_local;
  APInt *this_local;
  
  bVar1 = isMinSignedValue(RHS);
  local_29 = false;
  if (bVar1) {
    local_29 = isAllOnesValue((APInt *)Overflow);
  }
  *(bool *)CONCAT71(in_register_00000009,in_CL) = local_29;
  AVar2 = sdiv(this,RHS);
  AVar2.U.pVal = (uint64_t *)this;
  return AVar2;
}

Assistant:

APInt APInt::sdiv_ov(const APInt &RHS, bool &Overflow) const {
  // MININT/-1  -->  overflow.
  Overflow = isMinSignedValue() && RHS.isAllOnesValue();
  return sdiv(RHS);
}